

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O3

void __thiscall PatternGrid::mouseReleaseEvent(PatternGrid *this,QMouseEvent *evt)

{
  if (*(int *)(evt + 0x40) == 1) {
    if ((this->mMouseOp == dragging) || (this->mMouseOp == beginSelecting)) {
      PatternModel::deselect(this->mModel);
      PatternModel::setCursor
                (this->mModel,(PatternCursor)(this->mSelectionStart).super_PatternCursorBase);
    }
    this->mMouseOp = nothing;
  }
  return;
}

Assistant:

void PatternGrid::mouseReleaseEvent(QMouseEvent *evt) {

    if (evt->button() == Qt::LeftButton) {

        // if the user did not select anything, move the cursor to the starting coordinate
        if (mMouseOp == MouseOperation::beginSelecting || mMouseOp == MouseOperation::dragging) {
            mModel.deselect();
            mModel.setCursor(mSelectionStart);
        }

        mMouseOp = MouseOperation::nothing;
    }
}